

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

AutoFile * __thiscall
node::BlockManager::OpenUndoFile
          (AutoFile *__return_storage_ptr__,BlockManager *this,FlatFilePos *pos,bool fReadOnly)

{
  FILE *pFVar1;
  long in_FS_OFFSET;
  vector<std::byte,_std::allocator<std::byte>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = FlatFileSeq::Open(&this->m_undo_file_seq,pos,fReadOnly);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&local_48,&this->m_xor_key);
  __return_storage_ptr__->m_file = pFVar1;
  (__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile BlockManager::OpenUndoFile(const FlatFilePos& pos, bool fReadOnly) const
{
    return AutoFile{m_undo_file_seq.Open(pos, fReadOnly), m_xor_key};
}